

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_construct_local_link
              (mg_connection *conn,char *buf,size_t buflen,char *define_proto,int define_port,
              char *define_uri)

{
  byte bVar1;
  sa_family_t sVar2;
  int iVar3;
  mg_domain_context *pmVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *dst;
  ulong uVar8;
  __int32_t **pp_Var9;
  char *pcVar10;
  ulong uVar11;
  char cVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  bool bVar16;
  int truncated;
  char *local_90;
  char *local_88;
  size_t local_80;
  char portstr [16];
  char server_ip [48];
  
  if (conn == (mg_connection *)0x0) {
    return -1;
  }
  if (buf == (char *)0x0) {
    return -1;
  }
  if (buflen == 0) {
    return -1;
  }
  truncated = 0;
  local_90 = define_proto;
  if (define_proto == (char *)0x0) {
    bVar16 = (conn->request_info).is_ssl == 0;
    pcVar10 = "wss";
    if (bVar16) {
      pcVar10 = "ws";
    }
    local_90 = "https";
    if (bVar16) {
      local_90 = "http";
    }
    if (conn->protocol_type == 1) {
      local_90 = pcVar10;
    }
  }
  pcVar10 = (conn->request_info).request_uri;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = (conn->request_info).local_uri;
  }
  if (define_port < 1) {
    define_port = (conn->request_info).server_port;
  }
  if (pcVar10 == (char *)0x0) {
    return -1;
  }
  local_88 = buf;
  local_80 = buflen;
  sVar7 = strlen(pcVar10);
  sVar7 = sVar7 * 3 + 1;
  dst = (char *)malloc(sVar7);
  if (dst == (char *)0x0) {
    return -1;
  }
  mg_url_encode(pcVar10,dst,sVar7);
  cVar12 = *dst;
  uVar8 = 0;
  if (cVar12 != '\0') {
    uVar11 = 0;
    pcVar10 = dst;
    do {
      if (((cVar12 == '%') && (pcVar10[1] == '2')) && (pcVar10[2] == 'f')) {
        cVar12 = '/';
        lVar13 = 3;
      }
      else {
        lVar13 = 1;
      }
      uVar8 = lVar13 + (uVar8 & 0xffffffff);
      dst[uVar11] = cVar12;
      uVar11 = uVar11 + 1;
      pcVar10 = dst + uVar8;
      cVar12 = dst[uVar8];
    } while (cVar12 != '\0');
    uVar8 = uVar11 & 0xffffffff;
  }
  dst[uVar8] = '\0';
  if (define_proto == (char *)0x0) {
    iVar5 = 0x1bb;
    if ((conn->request_info).is_ssl == 0) {
      iVar5 = 0x50;
    }
  }
  else {
    iVar5 = strcmp(define_proto,"https");
    if (iVar5 != 0) {
      iVar6 = strcmp(define_proto,"wss");
      iVar5 = 0x50;
      if (iVar6 != 0) goto LAB_0010c647;
    }
    iVar5 = 0x1bb;
  }
LAB_0010c647:
  sVar2 = (conn->client).lsa.sa.sa_family;
  pmVar4 = conn->dom_ctx;
  pcVar10 = pmVar4->config[0x1f];
  if (pcVar10 == (char *)0x0) {
    bVar16 = false;
  }
  else {
    pp_Var9 = __ctype_tolower_loc();
    lVar13 = 0;
    do {
      bVar1 = pcVar10[lVar13];
      iVar6 = (*pp_Var9)[bVar1];
      iVar3 = (*pp_Var9)[(byte)"yes"[lVar13]];
      if (bVar1 == 0) break;
      lVar13 = lVar13 + 1;
    } while (iVar6 == iVar3);
    bVar16 = iVar6 == iVar3;
  }
  pcVar10 = pmVar4->config[0x1e];
  if (define_port == iVar5) {
    portstr[0] = '\0';
  }
  else {
    sprintf(portstr,":%u");
  }
  if (!(bool)(bVar16 & pcVar10 != (char *)0x0)) {
    pcVar10 = server_ip;
    sockaddr_to_string(pcVar10,0x30,&(conn->client).lsa);
  }
  bVar16 = sVar2 != 10;
  pcVar14 = "[";
  if (bVar16 || pcVar10 != server_ip) {
    pcVar14 = "";
  }
  pcVar15 = "]";
  if (bVar16 || pcVar10 != server_ip) {
    pcVar15 = "";
  }
  mg_snprintf(conn,&truncated,local_88,local_80,"%s://%s%s%s%s%s",local_90,pcVar14,pcVar10,pcVar15,
              portstr,dst);
  free(dst);
  return -(uint)(truncated != 0);
}

Assistant:

static int
mg_construct_local_link(const struct mg_connection *conn,
                        char *buf,
                        size_t buflen,
                        const char *define_proto,
                        int define_port,
                        const char *define_uri)
{
	if ((buflen < 1) || (buf == 0) || (conn == 0)) {
		return -1;
	} else {
		int i, j;
		int truncated = 0;
		const struct mg_request_info *ri = &conn->request_info;

		const char *proto =
		    (define_proto != NULL) ? define_proto : get_proto_name(conn);
		const char *uri =
		    (define_uri != NULL)
		        ? define_uri
		        : ((ri->request_uri != NULL) ? ri->request_uri : ri->local_uri);
		int port = (define_port > 0) ? define_port : ri->server_port;
		int default_port = 80;
		char *uri_encoded;
		size_t uri_encoded_len;

		if (uri == NULL) {
			return -1;
		}

		uri_encoded_len = strlen(uri) * 3 + 1;
		uri_encoded = (char *)mg_malloc_ctx(uri_encoded_len, conn->phys_ctx);
		if (uri_encoded == NULL) {
			return -1;
		}
		mg_url_encode(uri, uri_encoded, uri_encoded_len);

		/* Directory separator should be preserved. */
		for (i = j = 0; uri_encoded[i]; j++) {
			if (!strncmp(uri_encoded + i, "%2f", 3)) {
				uri_encoded[j] = '/';
				i += 3;
			} else {
				uri_encoded[j] = uri_encoded[i++];
			}
		}
		uri_encoded[j] = '\0';

#if defined(USE_X_DOM_SOCKET)
		if (conn->client.lsa.sa.sa_family == AF_UNIX) {
			/* TODO: Define and document a link for UNIX domain sockets. */
			/* There seems to be no official standard for this.
			 * Common uses seem to be "httpunix://", "http.unix://" or
			 * "http+unix://" as a protocol definition string, followed by
			 * "localhost" or "127.0.0.1" or "/tmp/unix/path" or
			 * "%2Ftmp%2Funix%2Fpath" (url % encoded) or
			 * "localhost:%2Ftmp%2Funix%2Fpath" (domain socket path as port) or
			 * "" (completely skipping the server name part). In any case, the
			 * last part is the server local path. */
			const char *server_name = UNIX_DOMAIN_SOCKET_SERVER_NAME;
			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
			            "%s.unix://%s%s",
			            proto,
			            server_name,
			            ri->local_uri);
			default_port = 0;
			mg_free(uri_encoded);
			return 0;
		}
#endif

		if (define_proto) {
			/* If we got a protocol name, use the default port accordingly. */
			if ((0 == strcmp(define_proto, "https"))
			    || (0 == strcmp(define_proto, "wss"))) {
				default_port = 443;
			}
		} else if (ri->is_ssl) {
			/* If we did not get a protocol name, use TLS as default if it is
			 * already used. */
			default_port = 443;
		}

		{
#if defined(USE_IPV6)
			int is_ipv6 = (conn->client.lsa.sa.sa_family == AF_INET6);
#endif
			int auth_domain_check_enabled =
			    conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK]
			    && (!mg_strcasecmp(
			           conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK], "yes"));

			const char *server_domain =
			    conn->dom_ctx->config[AUTHENTICATION_DOMAIN];

			char portstr[16];
			char server_ip[48];

			if (port != default_port) {
				sprintf(portstr, ":%u", (unsigned)port);
			} else {
				portstr[0] = 0;
			}

			if (!auth_domain_check_enabled || !server_domain) {

				sockaddr_to_string(server_ip,
				                   sizeof(server_ip),
				                   &conn->client.lsa);

				server_domain = server_ip;
			}

			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
#if defined(USE_IPV6)
			            "%s://%s%s%s%s%s",
			            proto,
			            (is_ipv6 && (server_domain == server_ip)) ? "[" : "",
			            server_domain,
			            (is_ipv6 && (server_domain == server_ip)) ? "]" : "",
#else
			            "%s://%s%s%s",
			            proto,
			            server_domain,
#endif
			            portstr,
			            uri_encoded);

			mg_free(uri_encoded);
			if (truncated) {
				return -1;
			}
			return 0;
		}
	}
}